

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Mesh::flip_selected_edge(Mesh *this)

{
  Scene *pSVar1;
  HalfedgeElement *pHVar2;
  XFormWidget *pXVar3;
  long lVar4;
  EdgeIter EVar5;
  
  pSVar1 = (this->super_SceneObject).scene;
  if (((pSVar1 != (Scene *)0x0) &&
      (pHVar2 = (pSVar1->selected).element, pHVar2 != (HalfedgeElement *)0x0)) &&
     (lVar4 = __dynamic_cast(pHVar2,&HalfedgeElement::typeinfo,&Edge::typeinfo,0), lVar4 != 0)) {
    EVar5 = HalfedgeMesh::flipEdge
                      (&this->mesh,*(_List_node_base **)(*(long *)(lVar4 + 0x58) + 0x30));
    pSVar1 = (this->super_SceneObject).scene;
    (pSVar1->selected).element = (HalfedgeElement *)(EVar5._M_node + 1);
    (pSVar1->hovered).object = (SceneObject *)0x0;
    (pSVar1->hovered).element = (HalfedgeElement *)0x0;
    (pSVar1->hovered).coordinates.z = 0.0;
    (pSVar1->hovered).coordinates.x = 0.0;
    (pSVar1->hovered).coordinates.y = 0.0;
    (pSVar1->hovered).axis = None;
    pXVar3 = ((this->super_SceneObject).scene)->elementTransform;
    (pXVar3->target).coordinates.z = 0.0;
    (pXVar3->target).coordinates.x = 0.0;
    (pXVar3->target).coordinates.y = 0.0;
    (pXVar3->target).object = (SceneObject *)0x0;
    (pXVar3->target).element = (HalfedgeElement *)0x0;
    (pXVar3->target).axis = None;
  }
  return;
}

Assistant:

void Mesh::flip_selected_edge() {
   if( scene == nullptr ) return;
   HalfedgeElement *element = scene->selected.element;
   if (element == nullptr) return;
   Edge *edge = element->getEdge();
   if (edge == nullptr) return;
   EdgeIter e = mesh.flipEdge(edge->halfedge()->edge());
   scene->selected.element = elementAddress( e );
   scene->hovered.clear();
   scene->elementTransform->target.clear();
}